

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O3

int __thiscall Fl_Help_View::find(Fl_Help_View *this,char *s,int p)

{
  byte *pbVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  Fl_Help_Block *pFVar9;
  uint __c;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  ulong local_50;
  
  if ((s != (char *)0x0) && (this->value_ != (char *)0x0)) {
    if (p < 0) {
      local_50 = 0;
    }
    else {
      sVar7 = strlen(this->value_);
      local_50 = 0;
      if ((p != 0) && (p < (int)sVar7)) {
        local_50 = (ulong)(p + 1);
      }
    }
    if (0 < this->nblocks_) {
      pFVar9 = this->blocks_;
      iVar4 = this->nblocks_;
      do {
        pcVar8 = this->value_ + local_50;
        if (pcVar8 <= pFVar9->end) {
          if (*s == '\0') {
LAB_001b278c:
            topline(this,pFVar9->y - pFVar9->h);
            return *(int *)&pFVar9->end - *(int *)&this->value_;
          }
          pcVar10 = pFVar9->start;
          pcVar11 = s;
          pcVar12 = pcVar10;
          if (pcVar10 < pcVar8) {
            pcVar10 = pcVar8;
            pcVar12 = pcVar8;
          }
          while( true ) {
            cVar2 = *pcVar10;
            __c = (uint)cVar2;
            if ((__c == 0) || (pFVar9->end <= pcVar10)) break;
            if (cVar2 == '&') {
              __c = quote_char(pcVar10 + 1);
              if ((int)__c < 0) {
                __c = 0x26;
              }
              else {
                pcVar10 = strchr(pcVar10 + 1,0x3b);
                pcVar10 = pcVar10 + 1;
              }
LAB_001b2757:
              iVar5 = tolower((int)*pcVar11);
              iVar6 = tolower(__c);
              if (iVar5 == iVar6) {
                pcVar11 = pcVar11 + 1;
              }
              else {
                pcVar10 = pcVar12 + 1;
                pcVar11 = s;
                pcVar12 = pcVar10;
              }
            }
            else {
              if (cVar2 != '<') goto LAB_001b2757;
              do {
                if ((pFVar9->end <= pcVar10) || ((char)__c == '>')) break;
                pbVar1 = (byte *)(pcVar10 + 1);
                __c = (uint)*pbVar1;
                pcVar10 = pcVar10 + 1;
              } while (*pbVar1 != 0);
            }
            pcVar10 = pcVar10 + 1;
            if (*pcVar11 == '\0') goto LAB_001b278c;
          }
        }
        pFVar9 = pFVar9 + 1;
        bVar3 = 1 < iVar4;
        iVar4 = iVar4 + -1;
      } while (bVar3);
    }
  }
  return -1;
}

Assistant:

int						// O - Matching position or -1 if not found
Fl_Help_View::find(const char *s,		// I - String to find
                   int        p)		// I - Starting position
{
  int		i,				// Looping var
		c;				// Current character
  Fl_Help_Block	*b;				// Current block
  const char	*bp,				// Block matching pointer
		*bs,				// Start of current comparison
		*sp;				// Search string pointer


  DEBUG_FUNCTION(__LINE__,__FUNCTION__);

  // Range check input and value...
  if (!s || !value_) return -1;

  if (p < 0 || p >= (int)strlen(value_)) p = 0;
  else if (p > 0) p ++;

  // Look for the string...
  for (i = nblocks_, b = blocks_; i > 0; i --, b ++) {
    if (b->end < (value_ + p))
      continue;

    if (b->start < (value_ + p)) bp = value_ + p;
    else bp = b->start;

    for (sp = s, bs = bp; *sp && *bp && bp < b->end; bp ++) {
      if (*bp == '<') {
        // skip to end of element...
	while (*bp && bp < b->end && *bp != '>') bp ++;
	continue;
      } else if (*bp == '&') {
        // decode HTML entity...
	if ((c = quote_char(bp + 1)) < 0) c = '&';	// *FIXME* UTF-8, see below
	else bp = strchr(bp + 1, ';') + 1;
      } else c = *bp;

      // *FIXME* *UTF-8* (A.S. 02/14/2016)
      // At this point c may be an arbitrary Unicode Code Point corresponding
      // to a quoted character (see above), i.e. it _can_ be a multi byte
      // UTF-8 sequence and must be compared with the corresponding
      // multi byte string in (*sp)...
      // For instance: "&euro;" == 0x20ac -> 0xe2 0x82 0xac (UTF-8: 3 bytes).
      // Hint: use fl_utf8encode() [see below]

      if (tolower(*sp) == tolower(c)) sp ++;
      else {
        // No match, so reset to start of search...
	sp = s;
	bs ++;
	bp = bs;
      }
    }

    if (!*sp) {
      // Found a match!
      topline(b->y - b->h);
      return (int) (b->end - value_);
    }
  }

  // No match!
  return (-1);
}